

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool __thiscall ghc::filesystem::path::has_stem(path *this)

{
  bool bVar1;
  path *in_stack_00000068;
  
  stem(in_stack_00000068);
  bVar1 = empty((path *)0x1d3b12);
  ~path((path *)0x1d3b22);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

GHC_INLINE bool path::has_stem() const
{
    return !stem().empty();
}